

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::RegExprNFAParseElement::ShiftToken
          (RegExprNFAParseElement *this,TokenType *token,
          TokenStream<SGParser::Generator::RegExprParseToken> *stream)

{
  RegExprParseToken local_28;
  TokenType tok;
  TokenStream<SGParser::Generator::RegExprParseToken> *stream_local;
  TokenType *token_local;
  RegExprNFAParseElement *this_local;
  
  (this->field_1).ch = token->ch;
  if (((this->field_1).ch == 0x5c) && ((token->super_TokenCode).Code != 1)) {
    tok = (TokenType)stream;
    RegExprParseToken::RegExprParseToken(&local_28);
    (**(code **)(*(long *)tok + 0x10))(tok,&local_28);
    (this->field_1).ch = local_28.ch;
    switch((this->field_1).ch) {
    case 0x62:
      (this->field_1).ch = 8;
      break;
    case 0x66:
      (this->field_1).ch = 0xc;
      break;
    case 0x6e:
      (this->field_1).ch = 10;
      break;
    case 0x72:
      (this->field_1).ch = 0xd;
      break;
    case 0x74:
      (this->field_1).ch = 9;
      break;
    case 0x76:
      (this->field_1).ch = 0xb;
    }
  }
  return;
}

Assistant:

void ShiftToken(TokenType& token, TokenStream<TokenType>& stream) {
        ch = token.ch;
        // If we are shifting token, parser will be looking at the next character next
        // So we can do this
        // Essentially, we are ignoring the next token code, and turning it into a character
        if (ch == '\\' && token.Code != TokenCode::TokenEOF) {
            TokenType tok;
            stream.GetNextToken(tok);
            ch = tok.ch;
            // Process characters with special meanings
            switch (ch) {
                case 'n': ch = '\n'; break;
                case 't': ch = '\t'; break;
                case 'v': ch = '\v'; break;
                case 'r': ch = '\r'; break;
                case 'f': ch = '\f'; break;
                case 'b': ch = '\b'; break;
            }
        }
    }